

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_movcf_ps(DisasContext_conflict6 *ctx,int fs,int fd,int cc,int tf)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i32 pTVar1;
  int iVar2;
  TCGv_i32 ret;
  TCGLabel *l;
  TCGLabel *l_00;
  TCGLabel *l2;
  TCGLabel *l1;
  TCGv_i32 t0;
  int cond;
  TCGContext_conflict6 *tcg_ctx;
  int tf_local;
  int cc_local;
  int fd_local;
  int fs_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx_00);
  l = gen_new_label_mips64el(tcg_ctx_00);
  l_00 = gen_new_label_mips64el(tcg_ctx_00);
  if (tf == 0) {
    t0._4_4_ = TCG_COND_NE;
  }
  else {
    t0._4_4_ = TCG_COND_EQ;
  }
  pTVar1 = tcg_ctx_00->fpu_fcr31;
  iVar2 = get_fp_bit(cc);
  tcg_gen_andi_i32_mips64el(tcg_ctx_00,ret,pTVar1,1 << ((byte)iVar2 & 0x1f));
  tcg_gen_brcondi_i32_mips64el(tcg_ctx_00,t0._4_4_,ret,0,l);
  gen_load_fpr32(ctx,ret,fs);
  gen_store_fpr32(ctx,ret,fd);
  gen_set_label(tcg_ctx_00,l);
  pTVar1 = tcg_ctx_00->fpu_fcr31;
  iVar2 = get_fp_bit(cc + 1);
  tcg_gen_andi_i32_mips64el(tcg_ctx_00,ret,pTVar1,1 << ((byte)iVar2 & 0x1f));
  tcg_gen_brcondi_i32_mips64el(tcg_ctx_00,t0._4_4_,ret,0,l_00);
  gen_load_fpr32h(ctx,ret,fs);
  gen_store_fpr32h(ctx,ret,fd);
  tcg_temp_free_i32(tcg_ctx_00,ret);
  gen_set_label(tcg_ctx_00,l_00);
  return;
}

Assistant:

static inline void gen_movcf_ps(DisasContext *ctx, int fs, int fd,
                                int cc, int tf)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int cond;
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
    TCGLabel *l1 = gen_new_label(tcg_ctx);
    TCGLabel *l2 = gen_new_label(tcg_ctx);

    if (tf) {
        cond = TCG_COND_EQ;
    } else {
        cond = TCG_COND_NE;
    }

    tcg_gen_andi_i32(tcg_ctx, t0, tcg_ctx->fpu_fcr31, 1 << get_fp_bit(cc));
    tcg_gen_brcondi_i32(tcg_ctx, cond, t0, 0, l1);
    gen_load_fpr32(ctx, t0, fs);
    gen_store_fpr32(ctx, t0, fd);
    gen_set_label(tcg_ctx, l1);

    tcg_gen_andi_i32(tcg_ctx, t0, tcg_ctx->fpu_fcr31, 1 << get_fp_bit(cc + 1));
    tcg_gen_brcondi_i32(tcg_ctx, cond, t0, 0, l2);
    gen_load_fpr32h(ctx, t0, fs);
    gen_store_fpr32h(ctx, t0, fd);
    tcg_temp_free_i32(tcg_ctx, t0);
    gen_set_label(tcg_ctx, l2);
}